

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall wabt::anon_unknown_19::BinaryReader::ReadSections(BinaryReader *this)

{
  Result RVar1;
  int iVar2;
  Enum EVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  uint local_15c;
  Index *pIStack_158;
  uint32_t section_code;
  Index *local_150;
  Index *local_148;
  Index *local_140;
  Index *local_138;
  Index *local_130;
  size_t local_128;
  Index *local_120;
  Index *local_118;
  uint32_t offset;
  uint32_t size;
  Type local_type;
  uint32_t version;
  uint32_t kind;
  uint32_t index;
  Index num_data_segments;
  Type param_type;
  Index func_index;
  uint32_t linking_type;
  uint32_t flags;
  uint32_t value;
  uint32_t reloc_type;
  undefined4 local_3c;
  
  if ((this->state_).size <= (this->state_).offset) {
    return (Result)Ok;
  }
  local_140 = &this->num_function_bodies_;
  local_138 = &this->num_exports_;
  local_130 = &this->num_globals_;
  local_120 = &this->num_memories_;
  local_118 = &this->num_tables_;
  local_148 = &this->num_function_signatures_;
  pIStack_158 = &this->num_imports_;
  local_150 = &this->num_signatures_;
  local_3c = 0;
  RVar1 = ReadU32Leb128(this,&local_15c,"section code");
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  RVar1 = ReadU32Leb128(this,&linking_type,"section size");
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  local_128 = this->read_end_;
  uVar4 = (this->state_).offset + (ulong)linking_type;
  this->read_end_ = uVar4;
  uVar6 = (ulong)local_15c;
  if (0xb < uVar6) {
    PrintError(this,"invalid section code: %u; max is %u",uVar6,0xb);
    goto LAB_00f40d3f;
  }
  if ((this->state_).size < uVar4) {
    pcVar5 = "invalid section size: extends past end";
LAB_00f40d22:
    PrintError(this,pcVar5);
  }
  else {
    if (((local_15c == 0) || (this->last_known_section_ == Invalid)) ||
       ((int)this->last_known_section_ < (int)local_15c)) {
      if ((local_15c == 0) || (this->did_read_names_section_ == false)) {
        iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[6])
                          (this->delegate_,uVar6,(ulong)linking_type);
        if (iVar2 == 0) {
          offset = (uint32_t)
                   CONCAT71((int7)((ulong)this->options_ >> 8),this->options_->stop_on_first_error);
          EVar3 = (*(code *)(&DAT_011defe0 + *(int *)(&DAT_011defe0 + uVar6 * 4)))();
          return (Result)EVar3;
        }
        pcVar5 = "BeginSection callback failed";
        goto LAB_00f40d22;
      }
      pcVar5 = "%s section can not occur after Name section";
    }
    else {
      pcVar5 = "section %s out of order";
    }
    PrintError(this,pcVar5,*(undefined8 *)(g_section_name + uVar6 * 8));
  }
LAB_00f40d3f:
  this->read_end_ = local_128;
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadSections() {
  Result result = Result::Ok;

  while (state_.offset < state_.size) {
    uint32_t section_code;
    Offset section_size;
    CHECK_RESULT(ReadU32Leb128(&section_code, "section code"));
    CHECK_RESULT(ReadOffset(&section_size, "section size"));
    ReadEndRestoreGuard guard(this);
    read_end_ = state_.offset + section_size;
    if (section_code >= kBinarySectionCount) {
      PrintError("invalid section code: %u; max is %u", section_code,
                 kBinarySectionCount - 1);
      return Result::Error;
    }

    BinarySection section = static_cast<BinarySection>(section_code);

    ERROR_UNLESS(read_end_ <= state_.size,
                 "invalid section size: extends past end");

    ERROR_UNLESS(last_known_section_ == BinarySection::Invalid ||
                     section == BinarySection::Custom ||
                     section > last_known_section_,
                 "section %s out of order", GetSectionName(section));

    ERROR_UNLESS(!did_read_names_section_ || section == BinarySection::Custom,
                 "%s section can not occur after Name section",
                 GetSectionName(section));

    CALLBACK(BeginSection, section, section_size);

    bool stop_on_first_error = options_.stop_on_first_error;
    Result section_result = Result::Error;
    switch (section) {
      case BinarySection::Custom:
        section_result = ReadCustomSection(section_size);
        if (options_.fail_on_custom_section_error) {
          result |= section_result;
        } else {
          stop_on_first_error = false;
        }
        break;
      case BinarySection::Type:
        section_result = ReadTypeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Import:
        section_result = ReadImportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Function:
        section_result = ReadFunctionSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Table:
        section_result = ReadTableSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Memory:
        section_result = ReadMemorySection(section_size);
        result |= section_result;
        break;
      case BinarySection::Global:
        section_result = ReadGlobalSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Export:
        section_result = ReadExportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Start:
        section_result = ReadStartSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Elem:
        section_result = ReadElemSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Code:
        section_result = ReadCodeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Data:
        section_result = ReadDataSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Invalid:
        WABT_UNREACHABLE;
    }

    if (Failed(section_result)) {
      if (stop_on_first_error) {
        return Result::Error;
      }

      // If we're continuing after failing to read this section, move the
      // offset to the expected section end. This way we may be able to read
      // further sections.
      state_.offset = read_end_;
    }

    ERROR_UNLESS(state_.offset == read_end_,
                 "unfinished section (expected end: 0x%" PRIzx ")", read_end_);

    if (section != BinarySection::Custom) {
      last_known_section_ = section;
    }
  }

  return result;
}